

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_lookup.cpp
# Opt level: O0

SN_ELEMENT * __thiscall ON_SerialNumberMap::FirstElement(ON_SerialNumberMap *this)

{
  ulong local_28;
  size_t j;
  size_t i;
  SN_ELEMENT *e;
  ON_SerialNumberMap *this_local;
  
  i = 0;
  for (j = 0; j < this->m_snblk_list_count; j = j + 1) {
    if (this->m_snblk_list[j]->m_purged < this->m_snblk_list[j]->m_count) {
      local_28 = 0;
      goto LAB_006b68fa;
    }
  }
LAB_006b697e:
  if ((this->m_sn_block0->m_purged < this->m_sn_block0->m_count) &&
     ((i == 0 || (this->m_sn_block0->m_sn0 < *(ulong *)(i + 0x10))))) {
    if (this->m_sn_block0->m_purged != 0) {
      Internal_HashTableInvalidate(this);
      this->m_sn_count = this->m_sn_count - (ulong)this->m_sn_block0->m_purged;
      this->m_sn_purged = this->m_sn_purged - (ulong)this->m_sn_block0->m_purged;
      ON_SN_BLOCK::CullBlockHelper(this->m_sn_block0);
    }
    if (this->m_sn_block0->m_sorted == 0) {
      Internal_HashTableInvalidate(this);
      ON_SN_BLOCK::SortBlockHelper(this->m_sn_block0);
    }
    if ((i == 0) || (this->m_sn_block0->m_sn0 < *(ulong *)(i + 0x10))) {
      i = (size_t)this->m_sn_block0->m_sn;
    }
  }
  return (SN_ELEMENT *)i;
LAB_006b68fa:
  if (this->m_snblk_list[j]->m_count <= local_28) goto LAB_006b697e;
  if (this->m_snblk_list[j]->m_sn[local_28].m_sn_active != '\0') {
    i = (size_t)(this->m_snblk_list[j]->m_sn + local_28);
    goto LAB_006b697e;
  }
  local_28 = local_28 + 1;
  goto LAB_006b68fa;
}

Assistant:

ON_SerialNumberMap::SN_ELEMENT* ON_SerialNumberMap::FirstElement() const
{
  SN_ELEMENT* e=nullptr;

  // The first element is likely to be m_snblk_list[0]->m_sn[0]
  // so start looking there.
  // The nullptr==e test isn't necessary. It is there to keep
  // the VisualC++ 2022 compiler from crashing.
  for(size_t i = 0; i < m_snblk_list_count && nullptr==e; i++)
  {
    if ( m_snblk_list[i]->m_count > m_snblk_list[i]->m_purged )
    {
      for (size_t j = 0; j < m_snblk_list[i]->m_count; j++ )
      {
        if ( m_snblk_list[i]->m_sn[j].m_sn_active )
        {
          e = &m_snblk_list[i]->m_sn[j];
          break;
        }
      }
      break;
    }
  }

  if ( m_sn_block0.m_count > m_sn_block0.m_purged 
       && (!e || m_sn_block0.m_sn0 < e->m_sn) 
     )
  {
    // It's possible the element is in m_sn_block0.
    if ( m_sn_block0.m_purged > 0 )
    {
      // remove purged elements from m_sn_block0.

      // memory location for specific elements will be changed.
      // This will make the hash table invalid.
      const_cast<ON_SerialNumberMap*>(this)->Internal_HashTableInvalidate();

      const_cast<ON_SerialNumberMap*>(this)->m_sn_count -= m_sn_block0.m_purged;
      const_cast<ON_SerialNumberMap*>(this)->m_sn_purged -= m_sn_block0.m_purged;
      const_cast<ON_SerialNumberMap*>(this)->m_sn_block0.CullBlockHelper();
    }
    if ( !m_sn_block0.m_sorted )
    {
      // sort elements in m_sn_block0.

      // memory location for specific elements will be changed.
      // This will make the hash table invalid.
      const_cast<ON_SerialNumberMap*>(this)->Internal_HashTableInvalidate();

      const_cast<ON_SerialNumberMap*>(this)->m_sn_block0.SortBlockHelper();      
    }
    if ( !e || m_sn_block0.m_sn0 <  e->m_sn )
    {
      // first element in m_sn_block0 is the
      // one with the smallest serial number.
      e = const_cast<struct SN_ELEMENT*>(&m_sn_block0.m_sn[0]);
    }
  }
  return e;
}